

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::serialize
          (StateRecorder *this,uint8_t **serialized_data,size_t *serialized_size)

{
  Impl *this_00;
  VkGraphicsPipelineCreateInfo *create_info;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  unordered_map<unsigned_long,_VkSamplerCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>_>
  *this_01;
  unordered_map<unsigned_long,_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>_>
  *this_02;
  unordered_map<unsigned_long,_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>_>
  *this_03;
  unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
  *this_04;
  unordered_map<unsigned_long,_void_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  *this_05;
  unordered_map<unsigned_long,_VkComputePipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>_>
  *this_06;
  unordered_map<unsigned_long,_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>_>
  *this_07;
  unsigned_long render_pass_hash;
  unordered_map<unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  *this_08;
  size_t sVar2;
  uint8_t *puVar3;
  Ch *__src;
  undefined1 local_428 [8];
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_3a0;
  reference local_390;
  pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*> *pipe_2;
  iterator __end1_7;
  iterator __begin1_7;
  unordered_map<unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  *__range1_7;
  Value raytracing_pipelines;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_350;
  SubpassMeta local_33a;
  reference ppStack_338;
  SubpassMeta subpass_meta;
  pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*> *pipe_1;
  iterator __end1_6;
  iterator __begin1_6;
  unordered_map<unsigned_long,_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>_>
  *__range1_6;
  Value graphics_pipelines;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_2f8;
  reference local_2e8;
  pair<const_unsigned_long,_VkComputePipelineCreateInfo_*> *pipe;
  iterator __end1_5;
  iterator __begin1_5;
  unordered_map<unsigned_long,_VkComputePipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>_>
  *__range1_5;
  Value compute_pipelines;
  GenericStringRef<char> local_2a8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_298;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_288;
  reference local_278;
  pair<const_unsigned_long,_void_*> *pass;
  iterator __end1_4;
  iterator __begin1_4;
  unordered_map<unsigned_long,_void_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  *__range1_4;
  Value render_passes2;
  Value render_passes;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_228;
  reference local_218;
  pair<const_unsigned_long,_VkShaderModuleCreateInfo_*> *module;
  iterator __end1_3;
  iterator __begin1_3;
  unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
  *__range1_3;
  Value shader_modules;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_1d8;
  reference local_1c8;
  pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*> *layout_1;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<unsigned_long,_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>_>
  *__range1_2;
  Value pipeline_layouts;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_188;
  reference local_178;
  pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*> *layout;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_long,_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>_>
  *__range1_1;
  Value set_layouts;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_138;
  reference local_128;
  pair<const_unsigned_long,_VkSamplerCreateInfo_*> *sampler;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_VkSamplerCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>_>
  *__range1;
  Value samplers;
  GenericStringRef<char> local_e8;
  undefined4 local_d4;
  undefined1 local_d0 [8];
  Value value;
  Value pdf_info;
  Value app_info;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Document doc;
  size_t *serialized_size_local;
  uint8_t **serialized_data_local;
  StateRecorder *this_local;
  
  if (this->impl->database_iface == (DatabaseInterface *)0x0) {
    doc.parseResult_.offset_ = (size_t)serialized_size;
    Impl::sync_thread(this->impl);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)&alloc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&alloc);
    allocator = rapidjson::
                GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)&alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>
              ((GenericStringRef<char> *)((long)&app_info.data_ + 8),(char (*) [8])0x62a218);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    AddMember<Fossilize::__2>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&alloc,(StringRefType *)((long)&app_info.data_ + 8),FOSSILIZE_FORMAT_VERSION,
               allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&pdf_info.data_ + 8),kObjectType);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)&value.data_ + 8),kObjectType);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_d0);
    if (this->impl->application_info != (VkApplicationInfo *)0x0) {
      serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Value *)((long)&pdf_info.data_ + 8),this->impl->application_info,allocator);
    }
    if ((this->impl->physical_device_features == (VkPhysicalDeviceFeatures2 *)0x0) ||
       (bVar1 = serialize_physical_device_features_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((Value *)((long)&value.data_ + 8),this->impl->physical_device_features,
                           allocator), bVar1)) {
      rapidjson::GenericStringRef<char>::GenericStringRef<16u>
                (&local_e8,(char (*) [16])"applicationInfo");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,&local_e8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&pdf_info.data_ + 8),allocator);
      rapidjson::GenericStringRef<char>::GenericStringRef<23u>
                ((GenericStringRef<char> *)((long)&samplers.data_ + 8),
                 (char (*) [23])"physicalDeviceFeatures");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&samplers.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&value.data_ + 8),allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1,kObjectType);
      this_01 = &this->impl->samplers;
      __end1 = std::
               unordered_map<unsigned_long,_VkSamplerCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>_>
               ::begin(this_01);
      sampler = (pair<const_unsigned_long,_VkSamplerCreateInfo_*> *)
                std::
                unordered_map<unsigned_long,_VkSamplerCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>_>
                ::end(this_01);
      while (bVar1 = std::__detail::operator!=
                               (&__end1.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>,_false>
                                  *)&sampler), bVar1) {
        local_128 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>,_false,_false>
                    ::operator*(&__end1);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_128->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164e50;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_138,local_128->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1,&local_138,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_138);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>,_false,_false>::
        operator++(&__end1);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>
                ((GenericStringRef<char> *)((long)&set_layouts.data_ + 8),(char (*) [9])"samplers");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&set_layouts.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_1,kObjectType);
      this_02 = &this->impl->descriptor_sets;
      __end1_1 = std::
                 unordered_map<unsigned_long,_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>_>
                 ::begin(this_02);
      layout = (pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*> *)
               std::
               unordered_map<unsigned_long,_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>_>
               ::end(this_02);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_1.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>,_false>
                                  *)&layout), bVar1) {
        local_178 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>,_false,_false>
                    ::operator*(&__end1_1);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_178->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164e44;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_188,local_178->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_1,&local_188,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_188);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>,_false,_false>
        ::operator++(&__end1_1);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                ((GenericStringRef<char> *)((long)&pipeline_layouts.data_ + 8),
                 (char (*) [11])"setLayouts");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&pipeline_layouts.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_1,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_2,kObjectType);
      this_03 = &this->impl->pipeline_layouts;
      __end1_2 = std::
                 unordered_map<unsigned_long,_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>_>
                 ::begin(this_03);
      layout_1 = (pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*> *)
                 std::
                 unordered_map<unsigned_long,_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>_>
                 ::end(this_03);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_2.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>,_false>
                                  *)&layout_1), bVar1) {
        local_1c8 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>,_false,_false>
                    ::operator*(&__end1_2);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_1c8->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164e38;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_1d8,local_1c8->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_2,&local_1d8,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_1d8);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>,_false,_false>::
        operator++(&__end1_2);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<16u>
                ((GenericStringRef<char> *)((long)&shader_modules.data_ + 8),
                 (char (*) [16])"pipelineLayouts");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&shader_modules.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_2,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_3,kObjectType);
      this_04 = &this->impl->shader_modules;
      __end1_3 = std::
                 unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
                 ::begin(this_04);
      module = (pair<const_unsigned_long,_VkShaderModuleCreateInfo_*> *)
               std::
               unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
               ::end(this_04);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_3.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_false>
                                  *)&module), bVar1) {
        local_218 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_false,_false>
                    ::operator*(&__end1_3);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_218->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164e2c;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_228,local_218->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_3,&local_228,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_228);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_false,_false>::
        operator++(&__end1_3);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                ((GenericStringRef<char> *)((long)&render_passes.data_ + 8),
                 (char (*) [14])"shaderModules");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&render_passes.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_3,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)((long)&render_passes2.data_ + 8),kObjectType);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_4,kObjectType);
      this_05 = &this->impl->render_passes;
      __end1_4 = std::
                 unordered_map<unsigned_long,_void_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
                 ::begin(this_05);
      pass = (pair<const_unsigned_long,_void_*> *)
             std::
             unordered_map<unsigned_long,_void_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
             ::end(this_05);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_4.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_void_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_void_*>,_false>
                                  *)&pass), bVar1) {
        local_278 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_void_*>,_false,_false>::operator*
                              (&__end1_4);
        if (*local_278->second == 0x26) {
          bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkRenderPassCreateInfo *)local_278->second,allocator,(Value *)local_d0
                            );
          if (!bVar1) {
            this_local._7_1_ = false;
            local_d4 = 1;
            goto LAB_00164e14;
          }
          uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Fossilize *)&local_288,local_278->first,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)((long)&render_passes2.data_ + 8),&local_288,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_d0,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_288);
        }
        else {
          if (*local_278->second != 0x3b9c73cc) {
            this_local._7_1_ = false;
            local_d4 = 1;
            goto LAB_00164e14;
          }
          bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((VkRenderPassCreateInfo2 *)local_278->second,allocator,
                             (Value *)local_d0);
          if (!bVar1) {
            this_local._7_1_ = false;
            local_d4 = 1;
            goto LAB_00164e14;
          }
          uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((Fossilize *)&local_298,local_278->first,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_4,&local_298,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_d0,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_298);
        }
        std::__detail::_Node_iterator<std::pair<const_unsigned_long,_void_*>,_false,_false>::
        operator++(&__end1_4);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_2a8,(char (*) [13])"renderPasses");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,&local_2a8,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&render_passes2.data_ + 8),allocator);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                ((GenericStringRef<char> *)((long)&compute_pipelines.data_ + 8),
                 (char (*) [14])"renderPasses2");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&compute_pipelines.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_4,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_5,kObjectType);
      this_06 = &this->impl->compute_pipelines;
      __end1_5 = std::
                 unordered_map<unsigned_long,_VkComputePipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>_>
                 ::begin(this_06);
      pipe = (pair<const_unsigned_long,_VkComputePipelineCreateInfo_*> *)
             std::
             unordered_map<unsigned_long,_VkComputePipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>_>
             ::end(this_06);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_5.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>,_false>
                                  *)&pipe), bVar1) {
        local_2e8 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>,_false,_false>
                    ::operator*(&__end1_5);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_2e8->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164e08;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_2f8,local_2e8->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_5,&local_2f8,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_2f8);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>,_false,_false>
        ::operator++(&__end1_5);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                ((GenericStringRef<char> *)((long)&graphics_pipelines.data_ + 8),
                 (char (*) [17])"computePipelines");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&graphics_pipelines.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_5,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_6,kObjectType);
      this_07 = &this->impl->graphics_pipelines;
      __end1_6 = std::
                 unordered_map<unsigned_long,_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>_>
                 ::begin(this_07);
      pipe_1 = (pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*> *)
               std::
               unordered_map<unsigned_long,_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>_>
               ::end(this_07);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_6.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>,_false>
                                  *)&pipe_1), bVar1) {
        ppStack_338 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                      ::operator*(&__end1_6);
        memset(&local_33a,0,2);
        this_00 = this->impl;
        create_info = ppStack_338->second;
        render_pass_hash =
             api_object_cast<unsigned_long,VkRenderPass_T*>(ppStack_338->second->renderPass);
        bVar1 = Impl::get_subpass_meta_for_pipeline(this_00,create_info,render_pass_hash,&local_33a)
        ;
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164dfc;
        }
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (ppStack_338->second,&local_33a,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164dfc;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_350,ppStack_338->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_6,&local_350,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_350);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>,_false,_false>
        ::operator++(&__end1_6);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<18u>
                ((GenericStringRef<char> *)((long)&raytracing_pipelines.data_ + 8),
                 (char (*) [18])"graphicsPipelines");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)((long)&raytracing_pipelines.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_6,allocator);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&__range1_7,kObjectType);
      this_08 = &this->impl->raytracing_pipelines;
      __end1_7 = std::
                 unordered_map<unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>_>
                 ::begin(this_08);
      pipe_2 = (pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*> *)
               std::
               unordered_map<unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>_>
               ::end(this_08);
      while (bVar1 = std::__detail::operator!=
                               (&__end1_7.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                                  *)&pipe_2), bVar1) {
        local_390 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
                    ::operator*(&__end1_7);
        bVar1 = Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (local_390->second,allocator,(Value *)local_d0);
        if (!bVar1) {
          this_local._7_1_ = false;
          local_d4 = 1;
          goto LAB_00164df0;
        }
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ((Fossilize *)&local_3a0,local_390->first,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&__range1_7,&local_3a0,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_d0,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_3a0);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
        ::operator++(&__end1_7);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<20u>
                ((GenericStringRef<char> *)&buffer.stack_.initialCapacity_,
                 (char (*) [20])"raytracingPipelines");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&alloc,(StringRefType *)&buffer.stack_.initialCapacity_,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&__range1_7,allocator);
      rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                          &writer.indentCharCount_,(CrtAllocator *)0x0,0x100);
      rapidjson::
      PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::PrettyWriter((PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)local_428,
                     (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.indentCharCount_,(CrtAllocator *)0x0,0x20);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&alloc,
                 (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *)local_428);
      sVar2 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              GetSize((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.indentCharCount_);
      *(size_t *)doc.parseResult_.offset_ = sVar2;
      sVar2 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              GetSize((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.indentCharCount_);
      puVar3 = (uint8_t *)operator_new__(sVar2);
      *serialized_data = puVar3;
      this_local._7_1_ = *serialized_data != (uint8_t *)0x0;
      if (this_local._7_1_) {
        puVar3 = *serialized_data;
        __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                          &writer.indentCharCount_);
        sVar2 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                GetSize((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        &writer.indentCharCount_);
        memcpy(puVar3,__src,sVar2);
      }
      local_d4 = 1;
      rapidjson::
      PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::~PrettyWriter((PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       *)local_428);
      rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      ~GenericStringBuffer
                ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                 &writer.indentCharCount_);
LAB_00164df0:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_7);
LAB_00164dfc:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_6);
LAB_00164e08:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_5);
LAB_00164e14:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_4);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)((long)&render_passes2.data_ + 8));
LAB_00164e2c:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_3);
LAB_00164e38:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_2);
LAB_00164e44:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1_1);
LAB_00164e50:
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&__range1);
    }
    else {
      this_local._7_1_ = false;
      local_d4 = 1;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_d0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&value.data_ + 8));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)((long)&pdf_info.data_ + 8));
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)&alloc);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::serialize(uint8_t **serialized_data, size_t *serialized_size)
{
	if (impl->database_iface)
		return false;

	impl->sync_thread();

	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);

	Value app_info(kObjectType);
	Value pdf_info(kObjectType);
	Value value;

	if (impl->application_info)
		serialize_application_info_inline(app_info, *impl->application_info, alloc);
	if (impl->physical_device_features)
		if (!serialize_physical_device_features_inline(pdf_info, *impl->physical_device_features, alloc))
			return false;

	doc.AddMember("applicationInfo", app_info, alloc);
	doc.AddMember("physicalDeviceFeatures", pdf_info, alloc);

	Value samplers(kObjectType);
	for (auto &sampler : impl->samplers)
	{
		if (!json_value(*sampler.second, alloc, &value))
			return false;
		samplers.AddMember(uint64_string(sampler.first, alloc), value, alloc);
	}
	doc.AddMember("samplers", samplers, alloc);

	Value set_layouts(kObjectType);
	for (auto &layout : impl->descriptor_sets)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		set_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("setLayouts", set_layouts, alloc);

	Value pipeline_layouts(kObjectType);
	for (auto &layout : impl->pipeline_layouts)
	{
		if (!json_value(*layout.second, alloc, &value))
			return false;
		pipeline_layouts.AddMember(uint64_string(layout.first, alloc), value, alloc);
	}
	doc.AddMember("pipelineLayouts", pipeline_layouts, alloc);

	Value shader_modules(kObjectType);
	for (auto &module : impl->shader_modules)
	{
		if (!json_value(*module.second, alloc, &value))
			return false;
		shader_modules.AddMember(uint64_string(module.first, alloc), value, alloc);
	}
	doc.AddMember("shaderModules", shader_modules, alloc);

	Value render_passes(kObjectType);
	Value render_passes2(kObjectType);
	for (auto &pass : impl->render_passes)
	{
		switch (static_cast<VkBaseInStructure *>(pass.second)->sType)
		{
		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO:
			if (!json_value(*static_cast<VkRenderPassCreateInfo *>(pass.second), alloc, &value))
				return false;
			render_passes.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2:
			if (!json_value(*static_cast<VkRenderPassCreateInfo2 *>(pass.second), alloc, &value))
				return false;
			render_passes2.AddMember(uint64_string(pass.first, alloc), value, alloc);
			break;

		default:
			return false;
		}
	}
	doc.AddMember("renderPasses", render_passes, alloc);
	doc.AddMember("renderPasses2", render_passes2, alloc);

	Value compute_pipelines(kObjectType);
	for (auto &pipe : impl->compute_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		compute_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("computePipelines", compute_pipelines, alloc);

	Value graphics_pipelines(kObjectType);
	for (auto &pipe : impl->graphics_pipelines)
	{
		SubpassMeta subpass_meta = {};
		if (!impl->get_subpass_meta_for_pipeline(*pipe.second, api_object_cast<Hash>(pipe.second->renderPass),
		                                         &subpass_meta))
			return false;
		if (!json_value(*pipe.second, subpass_meta, alloc, &value))
			return false;
		graphics_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("graphicsPipelines", graphics_pipelines, alloc);

	Value raytracing_pipelines(kObjectType);
	for (auto &pipe : impl->raytracing_pipelines)
	{
		if (!json_value(*pipe.second, alloc, &value))
			return false;
		raytracing_pipelines.AddMember(uint64_string(pipe.first, alloc), value, alloc);
	}
	doc.AddMember("raytracingPipelines", raytracing_pipelines, alloc);

	StringBuffer buffer;
	PrettyWriter<StringBuffer> writer(buffer);
	doc.Accept(writer);

	*serialized_size = buffer.GetSize();
	*serialized_data = new uint8_t[buffer.GetSize()];
	if (*serialized_data)
	{
		memcpy(*serialized_data, buffer.GetString(), buffer.GetSize());
		return true;
	}
	else
		return false;
}